

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

Acec_Box_t *
Acec_DeriveBox(Gia_Man_t *p,Vec_Bit_t *vIgnore,int fFilterIn,int fFilterOut,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vTree;
  void *__ptr;
  Vec_Int_t *vAdds;
  Vec_Wec_t *__ptr_00;
  Acec_Box_t *pBox;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  pBox = (Acec_Box_t *)0x0;
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,fVerbose);
  __ptr_00 = Acec_TreeFindTrees(p,vAdds,vIgnore,fFilterIn,fFilterOut);
  if (__ptr_00 == (Vec_Wec_t *)0x0) goto LAB_006892ea;
  vTree = __ptr_00->pArray;
  if (__ptr_00->nSize < 1) {
LAB_006892a1:
    pBox = (Acec_Box_t *)0x0;
  }
  else {
    pBox = Acec_CreateBox(p,vAdds,vTree);
    Acec_VerifyBoxLeaves(pBox,vIgnore);
    uVar2 = 0;
    if (pBox == (Acec_Box_t *)0x0) goto LAB_006892a1;
    lVar3 = (long)pBox->vAdds->nSize;
    if (0 < lVar3) {
      lVar4 = 0;
      uVar2 = 0;
      do {
        uVar2 = (ulong)(uint)((int)uVar2 + *(int *)((long)&pBox->vAdds->pArray->nSize + lVar4));
        lVar4 = lVar4 + 0x10;
      } while (lVar3 << 4 != lVar4);
    }
    lVar4 = (long)pBox->vLeafLits->nSize;
    uVar7 = 0;
    uVar6 = 0;
    if (0 < lVar4) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar6 = (ulong)(uint)((int)uVar6 + *(int *)((long)&pBox->vLeafLits->pArray->nSize + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (lVar4 * 0x10 != lVar5);
    }
    lVar4 = (long)pBox->vRootLits->nSize;
    if (0 < lVar4) {
      lVar5 = 0;
      uVar7 = 0;
      do {
        uVar7 = (ulong)(uint)((int)uVar7 + *(int *)((long)&pBox->vRootLits->pArray->nSize + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (lVar4 * 0x10 != lVar5);
    }
    printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",0,lVar3,
           uVar2,uVar6,uVar7);
    if (fVerbose != 0) {
      Acec_TreePrintBox(pBox,vAdds);
    }
  }
  iVar1 = __ptr_00->nCap;
  if ((long)iVar1 < 1) {
    if (vTree != (Vec_Int_t *)0x0) goto LAB_006892da;
  }
  else {
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&vTree->pArray + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&vTree->pArray + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
LAB_006892da:
    free(vTree);
  }
  free(__ptr_00);
LAB_006892ea:
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
  }
  free(vAdds);
  return pBox;
}

Assistant:

Acec_Box_t * Acec_DeriveBox( Gia_Man_t * p, Vec_Bit_t * vIgnore, int fFilterIn, int fFilterOut, int fVerbose )
{
    Acec_Box_t * pBox = NULL;
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, fVerbose );
    Vec_Wec_t * vTrees = Acec_TreeFindTrees( p, vAdds, vIgnore, fFilterIn, fFilterOut );
    if ( vTrees && Vec_WecSize(vTrees) > 0 )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, 0) );
        Acec_VerifyBoxLeaves( pBox, vIgnore );
    }
    if ( pBox )//&& fVerbose )
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            0, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
    if ( pBox && fVerbose )
        Acec_TreePrintBox( pBox, vAdds );
    //Acec_PrintAdders( pBox0->vAdds, vAdds );
    //Acec_MultDetectInputs( p, pBox->vLeafLits, pBox->vRootLits );
    Vec_WecFreeP( &vTrees );
    Vec_IntFree( vAdds );
    return pBox;
}